

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-updating.cpp
# Opt level: O2

void __thiscall wasm::GlobalTypeRewriter::mapTypes(GlobalTypeRewriter *this,TypeMap *oldToNewTypes)

{
  Walker<CodeUpdater,_wasm::UnifiedExpressionVisitor<CodeUpdater,_void>_> *this_00;
  __node_base_ptr *pp_Var1;
  pointer puVar2;
  Function *pFVar3;
  pointer pTVar4;
  Module *pMVar5;
  pointer puVar6;
  Global *pGVar7;
  pointer puVar8;
  pointer ppEVar9;
  pointer puVar10;
  DataSegment *pDVar11;
  pointer puVar12;
  pointer puVar13;
  Tag *pTVar14;
  HeapType HVar15;
  Type TVar16;
  Type TVar17;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *func;
  pointer puVar18;
  pointer puVar19;
  pointer puVar20;
  pointer puVar21;
  pointer puVar22;
  ElementSegment *pEVar23;
  unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_> *tag;
  pointer ppEVar24;
  pointer puVar25;
  Type *var;
  pointer pTVar26;
  undefined1 local_278 [8];
  PassRunner runner;
  CodeUpdater updater;
  
  updater.
  super_WalkerPass<wasm::PostWalker<CodeUpdater,_wasm::UnifiedExpressionVisitor<CodeUpdater,_void>_>_>
  .super_Pass.runner =
       (PassRunner *)
       &updater.
        super_WalkerPass<wasm::PostWalker<CodeUpdater,_wasm::UnifiedExpressionVisitor<CodeUpdater,_void>_>_>
        .super_Pass.name._M_string_length;
  updater.
  super_WalkerPass<wasm::PostWalker<CodeUpdater,_wasm::UnifiedExpressionVisitor<CodeUpdater,_void>_>_>
  .super_Pass._vptr_Pass = (_func_int **)0x0;
  updater.
  super_WalkerPass<wasm::PostWalker<CodeUpdater,_wasm::UnifiedExpressionVisitor<CodeUpdater,_void>_>_>
  .super_Pass.name._M_dataplus._M_p = (pointer)0x0;
  updater.
  super_WalkerPass<wasm::PostWalker<CodeUpdater,_wasm::UnifiedExpressionVisitor<CodeUpdater,_void>_>_>
  .super_Pass.name._M_string_length._0_1_ = 0;
  this_00 = (Walker<CodeUpdater,_wasm::UnifiedExpressionVisitor<CodeUpdater,_void>_> *)
            (&updater.
              super_WalkerPass<wasm::PostWalker<CodeUpdater,_wasm::UnifiedExpressionVisitor<CodeUpdater,_void>_>_>
              .super_Pass.name.field_2._M_allocated_capacity + 1);
  updater.
  super_WalkerPass<wasm::PostWalker<CodeUpdater,_wasm::UnifiedExpressionVisitor<CodeUpdater,_void>_>_>
  .super_Pass.name.field_2._8_8_ = 0;
  updater.
  super_WalkerPass<wasm::PostWalker<CodeUpdater,_wasm::UnifiedExpressionVisitor<CodeUpdater,_void>_>_>
  .super_PostWalker<CodeUpdater,_wasm::UnifiedExpressionVisitor<CodeUpdater,_void>_>.
  super_Walker<CodeUpdater,_wasm::UnifiedExpressionVisitor<CodeUpdater,_void>_>.replacep =
       (Expression **)0x0;
  updater.
  super_WalkerPass<wasm::PostWalker<CodeUpdater,_wasm::UnifiedExpressionVisitor<CodeUpdater,_void>_>_>
  .super_PostWalker<CodeUpdater,_wasm::UnifiedExpressionVisitor<CodeUpdater,_void>_>.
  super_Walker<CodeUpdater,_wasm::UnifiedExpressionVisitor<CodeUpdater,_void>_>.stack.fixed._M_elems
  [9].currp = (Expression **)0x0;
  updater.
  super_WalkerPass<wasm::PostWalker<CodeUpdater,_wasm::UnifiedExpressionVisitor<CodeUpdater,_void>_>_>
  .super_PostWalker<CodeUpdater,_wasm::UnifiedExpressionVisitor<CodeUpdater,_void>_>.
  super_Walker<CodeUpdater,_wasm::UnifiedExpressionVisitor<CodeUpdater,_void>_>.stack.flexible.
  super__Vector_base<wasm::Walker<CodeUpdater,_wasm::UnifiedExpressionVisitor<CodeUpdater,_void>_>::Task,_std::allocator<wasm::Walker<CodeUpdater,_wasm::UnifiedExpressionVisitor<CodeUpdater,_void>_>::Task>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  updater.
  super_WalkerPass<wasm::PostWalker<CodeUpdater,_wasm::UnifiedExpressionVisitor<CodeUpdater,_void>_>_>
  .super_PostWalker<CodeUpdater,_wasm::UnifiedExpressionVisitor<CodeUpdater,_void>_>.
  super_Walker<CodeUpdater,_wasm::UnifiedExpressionVisitor<CodeUpdater,_void>_>.stack.flexible.
  super__Vector_base<wasm::Walker<CodeUpdater,_wasm::UnifiedExpressionVisitor<CodeUpdater,_void>_>::Task,_std::allocator<wasm::Walker<CodeUpdater,_wasm::UnifiedExpressionVisitor<CodeUpdater,_void>_>::Task>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  updater.
  super_WalkerPass<wasm::PostWalker<CodeUpdater,_wasm::UnifiedExpressionVisitor<CodeUpdater,_void>_>_>
  .super_PostWalker<CodeUpdater,_wasm::UnifiedExpressionVisitor<CodeUpdater,_void>_>.
  super_Walker<CodeUpdater,_wasm::UnifiedExpressionVisitor<CodeUpdater,_void>_>.stack.flexible.
  super__Vector_base<wasm::Walker<CodeUpdater,_wasm::UnifiedExpressionVisitor<CodeUpdater,_void>_>::Task,_std::allocator<wasm::Walker<CodeUpdater,_wasm::UnifiedExpressionVisitor<CodeUpdater,_void>_>::Task>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  updater.
  super_WalkerPass<wasm::PostWalker<CodeUpdater,_wasm::UnifiedExpressionVisitor<CodeUpdater,_void>_>_>
  .super_PostWalker<CodeUpdater,_wasm::UnifiedExpressionVisitor<CodeUpdater,_void>_>.
  super_Walker<CodeUpdater,_wasm::UnifiedExpressionVisitor<CodeUpdater,_void>_>.currFunction =
       (Function *)0x0;
  runner.skippedPasses._M_h._M_single_bucket = (__node_base_ptr)&PTR__WalkerPass_00e22350;
  updater.
  super_WalkerPass<wasm::PostWalker<CodeUpdater,_wasm::UnifiedExpressionVisitor<CodeUpdater,_void>_>_>
  .super_PostWalker<CodeUpdater,_wasm::UnifiedExpressionVisitor<CodeUpdater,_void>_>.
  super_Walker<CodeUpdater,_wasm::UnifiedExpressionVisitor<CodeUpdater,_void>_>.currModule =
       (Module *)oldToNewTypes;
  PassRunner::PassRunner((PassRunner *)local_278,this->wasm);
  puVar2 = (this->wasm->functions).
           super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pp_Var1 = &runner.skippedPasses._M_h._M_single_bucket;
  for (puVar18 = (this->wasm->functions).
                 super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; puVar18 != puVar2; puVar18 = puVar18 + 1
      ) {
    HVar15 = mapTypes(std::unordered_map<wasm::HeapType,wasm::HeapType,std::hash<wasm::HeapType>,std
             ::equal_to<wasm::HeapType>,std::allocator<std::pair<wasm::HeapType_const,wasm::
             HeapType>>>const&)::CodeUpdater::getNew(wasm::HeapType_
                       (pp_Var1,(((puVar18->_M_t).
                                  super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                                  .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl)->
                                type).id);
    pFVar3 = (puVar18->_M_t).
             super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
             super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
             super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
    (pFVar3->type).id = HVar15.id;
    pTVar4 = *(pointer *)
              ((long)&(pFVar3->vars).super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_> + 8
              );
    for (pTVar26 = *(pointer *)
                    &(pFVar3->vars).super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>.
                     _M_impl; pTVar26 != pTVar4; pTVar26 = pTVar26 + 1) {
      TVar16 = mapTypes(std::unordered_map<wasm::HeapType,wasm::HeapType,std::hash<wasm::
               HeapType>,std::equal_to<wasm::HeapType>,std::allocator<std::pair<wasm::
               HeapType_const,wasm::HeapType>>>const&)::CodeUpdater::getNew(wasm::Type_
                         (pp_Var1,pTVar26->id);
      pTVar26->id = TVar16.id;
    }
  }
  pMVar5 = this->wasm;
  pp_Var1 = &runner.skippedPasses._M_h._M_single_bucket;
  Pass::setPassRunner((Pass *)pp_Var1,(PassRunner *)local_278);
  (*(code *)runner.skippedPasses._M_h._M_single_bucket[2]._M_nxt)(pp_Var1,pMVar5);
  pMVar5 = this->wasm;
  puVar6 = (pMVar5->globals).
           super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  updater.
  super_WalkerPass<wasm::PostWalker<CodeUpdater,_wasm::UnifiedExpressionVisitor<CodeUpdater,_void>_>_>
  .super_PostWalker<CodeUpdater,_wasm::UnifiedExpressionVisitor<CodeUpdater,_void>_>.
  super_Walker<CodeUpdater,_wasm::UnifiedExpressionVisitor<CodeUpdater,_void>_>.currFunction =
       (Function *)pMVar5;
  for (puVar22 = (pMVar5->globals).
                 super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; puVar22 != puVar6; puVar22 = puVar22 + 1
      ) {
    pGVar7 = (puVar22->_M_t).super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>
             ._M_t.super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
             super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl;
    if (*(char **)((long)&(pGVar7->super_Importable).module + 8) == (char *)0x0) {
      Walker<CodeUpdater,_wasm::UnifiedExpressionVisitor<CodeUpdater,_void>_>::walk
                (this_00,&pGVar7->init);
    }
  }
  puVar8 = (pMVar5->elementSegments).
           super__Vector_base<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar21 = (pMVar5->elementSegments).
                 super__Vector_base<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; puVar21 != puVar8; puVar21 = puVar21 + 1
      ) {
    pEVar23 = (puVar21->_M_t).
              super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>
              ._M_t.
              super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
              .super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl;
    if (pEVar23->offset != (Expression *)0x0) {
      Walker<CodeUpdater,_wasm::UnifiedExpressionVisitor<CodeUpdater,_void>_>::walk
                (this_00,&pEVar23->offset);
      pEVar23 = (puVar21->_M_t).
                super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>
                ._M_t.
                super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
                .super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl;
    }
    ppEVar9 = *(pointer *)
               ((long)&(pEVar23->data).
                       super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                       _M_impl + 8);
    for (ppEVar24 = (pEVar23->data).
                    super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                    _M_impl.super__Vector_impl_data._M_start; ppEVar24 != ppEVar9;
        ppEVar24 = ppEVar24 + 1) {
      updater.oldToNewTypes = (TypeMap *)*ppEVar24;
      Walker<CodeUpdater,_wasm::UnifiedExpressionVisitor<CodeUpdater,_void>_>::walk
                (this_00,(Expression **)&updater.oldToNewTypes);
    }
  }
  puVar10 = (pMVar5->dataSegments).
            super__Vector_base<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar19 = (pMVar5->dataSegments).
                 super__Vector_base<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; puVar19 != puVar10;
      puVar19 = puVar19 + 1) {
    pDVar11 = (puVar19->_M_t).
              super___uniq_ptr_impl<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>._M_t
              .super__Tuple_impl<0UL,_wasm::DataSegment_*,_std::default_delete<wasm::DataSegment>_>.
              super__Head_base<0UL,_wasm::DataSegment_*,_false>._M_head_impl;
    if (pDVar11->offset != (Expression *)0x0) {
      Walker<CodeUpdater,_wasm::UnifiedExpressionVisitor<CodeUpdater,_void>_>::walk
                (this_00,&pDVar11->offset);
    }
  }
  updater.
  super_WalkerPass<wasm::PostWalker<CodeUpdater,_wasm::UnifiedExpressionVisitor<CodeUpdater,_void>_>_>
  .super_PostWalker<CodeUpdater,_wasm::UnifiedExpressionVisitor<CodeUpdater,_void>_>.
  super_Walker<CodeUpdater,_wasm::UnifiedExpressionVisitor<CodeUpdater,_void>_>.currFunction =
       (Function *)0x0;
  puVar12 = (this->wasm->tables).
            super__Vector_base<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar20 = (this->wasm->tables).
                 super__Vector_base<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; puVar20 != puVar12;
      puVar20 = puVar20 + 1) {
    TVar16 = mapTypes(std::unordered_map<wasm::HeapType,wasm::HeapType,std::hash<wasm::HeapType>,std
             ::equal_to<wasm::HeapType>,std::allocator<std::pair<wasm::HeapType_const,wasm::
             HeapType>>>const&)::CodeUpdater::getNew(wasm::Type_
                       (&runner.skippedPasses._M_h._M_single_bucket,
                        (((puVar20->_M_t).
                          super___uniq_ptr_impl<wasm::Table,_std::default_delete<wasm::Table>_>._M_t
                          .super__Tuple_impl<0UL,_wasm::Table_*,_std::default_delete<wasm::Table>_>.
                          super__Head_base<0UL,_wasm::Table_*,_false>._M_head_impl)->type).id);
    (((puVar20->_M_t).super___uniq_ptr_impl<wasm::Table,_std::default_delete<wasm::Table>_>._M_t.
      super__Tuple_impl<0UL,_wasm::Table_*,_std::default_delete<wasm::Table>_>.
      super__Head_base<0UL,_wasm::Table_*,_false>._M_head_impl)->type).id = TVar16.id;
  }
  puVar8 = (this->wasm->elementSegments).
           super__Vector_base<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar21 = (this->wasm->elementSegments).
                 super__Vector_base<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; puVar21 != puVar8; puVar21 = puVar21 + 1
      ) {
    TVar16 = mapTypes(std::unordered_map<wasm::HeapType,wasm::HeapType,std::hash<wasm::HeapType>,std
             ::equal_to<wasm::HeapType>,std::allocator<std::pair<wasm::HeapType_const,wasm::
             HeapType>>>const&)::CodeUpdater::getNew(wasm::Type_
                       (&runner.skippedPasses._M_h._M_single_bucket,
                        (((puVar21->_M_t).
                          super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
                          .super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl)->type)
                        .id);
    (((puVar21->_M_t).
      super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>._M_t.
      super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>.
      super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl)->type).id = TVar16.id;
  }
  puVar6 = (this->wasm->globals).
           super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar22 = (this->wasm->globals).
                 super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; puVar22 != puVar6; puVar22 = puVar22 + 1
      ) {
    TVar16 = mapTypes(std::unordered_map<wasm::HeapType,wasm::HeapType,std::hash<wasm::HeapType>,std
             ::equal_to<wasm::HeapType>,std::allocator<std::pair<wasm::HeapType_const,wasm::
             HeapType>>>const&)::CodeUpdater::getNew(wasm::Type_
                       (&runner.skippedPasses._M_h._M_single_bucket,
                        (((puVar22->_M_t).
                          super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>.
                          _M_t.
                          super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>
                          .super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl)->type).id);
    (((puVar22->_M_t).super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>._M_t.
      super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
      super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl)->type).id = TVar16.id;
  }
  puVar13 = (this->wasm->tags).
            super__Vector_base<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>,_std::allocator<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  pp_Var1 = &runner.skippedPasses._M_h._M_single_bucket;
  for (puVar25 = (this->wasm->tags).
                 super__Vector_base<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>,_std::allocator<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; puVar25 != puVar13;
      puVar25 = puVar25 + 1) {
    pTVar14 = (puVar25->_M_t).super___uniq_ptr_impl<wasm::Tag,_std::default_delete<wasm::Tag>_>._M_t
              .super__Tuple_impl<0UL,_wasm::Tag_*,_std::default_delete<wasm::Tag>_>.
              super__Head_base<0UL,_wasm::Tag_*,_false>._M_head_impl;
    TVar16.id = (pTVar14->sig).results.id;
    TVar17 = mapTypes(std::unordered_map<wasm::HeapType,wasm::HeapType,std::hash<wasm::HeapType>,std
             ::equal_to<wasm::HeapType>,std::allocator<std::pair<wasm::HeapType_const,wasm::
             HeapType>>>const&)::CodeUpdater::getNew(wasm::Type_(pp_Var1,(pTVar14->sig).params.id);
    TVar16 = mapTypes(std::unordered_map<wasm::HeapType,wasm::HeapType,std::hash<wasm::HeapType>,std
             ::equal_to<wasm::HeapType>,std::allocator<std::pair<wasm::HeapType_const,wasm::
             HeapType>>>const&)::CodeUpdater::getNew(wasm::Type_(pp_Var1,TVar16);
    pTVar14 = (puVar25->_M_t).super___uniq_ptr_impl<wasm::Tag,_std::default_delete<wasm::Tag>_>._M_t
              .super__Tuple_impl<0UL,_wasm::Tag_*,_std::default_delete<wasm::Tag>_>.
              super__Head_base<0UL,_wasm::Tag_*,_false>._M_head_impl;
    (pTVar14->sig).params.id = TVar17.id;
    (pTVar14->sig).results.id = TVar16.id;
  }
  PassRunner::~PassRunner((PassRunner *)local_278);
  WalkerPass<wasm::PostWalker<CodeUpdater,_wasm::UnifiedExpressionVisitor<CodeUpdater,_void>_>_>::
  ~WalkerPass((WalkerPass<wasm::PostWalker<CodeUpdater,_wasm::UnifiedExpressionVisitor<CodeUpdater,_void>_>_>
               *)&runner.skippedPasses._M_h._M_single_bucket);
  return;
}

Assistant:

void GlobalTypeRewriter::mapTypes(const TypeMap& oldToNewTypes) {
  // Replace all the old types in the module with the new ones.
  struct CodeUpdater
    : public WalkerPass<
        PostWalker<CodeUpdater, UnifiedExpressionVisitor<CodeUpdater>>> {
    bool isFunctionParallel() override { return true; }

    const TypeMap& oldToNewTypes;

    CodeUpdater(const TypeMap& oldToNewTypes) : oldToNewTypes(oldToNewTypes) {}

    std::unique_ptr<Pass> create() override {
      return std::make_unique<CodeUpdater>(oldToNewTypes);
    }

    Type getNew(Type type) {
      if (type.isRef()) {
        return Type(getNew(type.getHeapType()), type.getNullability());
      }
      if (type.isTuple()) {
        auto tuple = type.getTuple();
        for (auto& t : tuple.types) {
          t = getNew(t);
        }
        return Type(tuple);
      }
      return type;
    }

    HeapType getNew(HeapType type) {
      if (type.isBasic()) {
        return type;
      }
      auto iter = oldToNewTypes.find(type);
      if (iter != oldToNewTypes.end()) {
        return iter->second;
      }
      return type;
    }

    Signature getNew(Signature sig) {
      return Signature(getNew(sig.params), getNew(sig.results));
    }

    void visitExpression(Expression* curr) {
      // local.get and local.tee are special in that their type is tied to the
      // type of the local in the function, which is tied to the signature. That
      // means we must update it based on the signature, and not on the old type
      // in the local.
      //
      // We have already updated function signatures by the time we get here,
      // which means we can just apply the current local type that we see (there
      // is no need to call getNew(), which we already did on the function's
      // signature itself).
      if (auto* get = curr->dynCast<LocalGet>()) {
        curr->type = getFunction()->getLocalType(get->index);
        return;
      } else if (auto* tee = curr->dynCast<LocalSet>()) {
        // Rule out a local.set and unreachable code.
        if (tee->type != Type::none && tee->type != Type::unreachable) {
          curr->type = getFunction()->getLocalType(tee->index);
        }
        return;
      }

      // Update the type to the new one.
      curr->type = getNew(curr->type);

      // Update any other type fields as well.

#define DELEGATE_ID curr->_id

#define DELEGATE_START(id) [[maybe_unused]] auto* cast = curr->cast<id>();

#define DELEGATE_GET_FIELD(id, field) cast->field

#define DELEGATE_FIELD_TYPE(id, field) cast->field = getNew(cast->field);

#define DELEGATE_FIELD_HEAPTYPE(id, field) cast->field = getNew(cast->field);

#define DELEGATE_FIELD_CHILD(id, field)
#define DELEGATE_FIELD_OPTIONAL_CHILD(id, field)
#define DELEGATE_FIELD_INT(id, field)
#define DELEGATE_FIELD_INT_ARRAY(id, field)
#define DELEGATE_FIELD_LITERAL(id, field)
#define DELEGATE_FIELD_NAME(id, field)
#define DELEGATE_FIELD_NAME_VECTOR(id, field)
#define DELEGATE_FIELD_SCOPE_NAME_DEF(id, field)
#define DELEGATE_FIELD_SCOPE_NAME_USE(id, field)
#define DELEGATE_FIELD_SCOPE_NAME_USE_VECTOR(id, field)
#define DELEGATE_FIELD_ADDRESS(id, field)

#include "wasm-delegations-fields.def"
    }
  };

  CodeUpdater updater(oldToNewTypes);
  PassRunner runner(&wasm);

  // Update functions first, so that we see the updated types for locals (which
  // can change if the function signature changes).
  for (auto& func : wasm.functions) {
    func->type = updater.getNew(func->type);
    for (auto& var : func->vars) {
      var = updater.getNew(var);
    }
  }

  updater.run(&runner, &wasm);
  updater.walkModuleCode(&wasm);

  // Update global locations that refer to types.
  for (auto& table : wasm.tables) {
    table->type = updater.getNew(table->type);
  }
  for (auto& elementSegment : wasm.elementSegments) {
    elementSegment->type = updater.getNew(elementSegment->type);
  }
  for (auto& global : wasm.globals) {
    global->type = updater.getNew(global->type);
  }
  for (auto& tag : wasm.tags) {
    tag->sig = updater.getNew(tag->sig);
  }
}